

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.h
# Opt level: O0

void __thiscall
aeron::ClientConductor::ClientConductor
          (ClientConductor *this,epoch_clock_t *epochClock,DriverProxy *driverProxy,
          CopyBroadcastReceiver *broadcastReceiver,AtomicBuffer *counterMetadataBuffer,
          AtomicBuffer *counterValuesBuffer,on_new_publication_t *newPublicationHandler,
          on_new_publication_t *newExclusivePublicationHandler,
          on_new_subscription_t *newSubscriptionHandler,exception_handler_t *errorHandler,
          on_available_counter_t *availableCounterHandler,
          on_unavailable_counter_t *unavailableCounterHandler,long driverTimeoutMs,
          long resourceLingerTimeoutMs,longlong interServiceTimeoutNs)

{
  longlong lVar1;
  CopyBroadcastReceiver *in_RCX;
  DriverProxy *in_RDX;
  function<long_long_()> *in_RSI;
  ClientConductor *in_RDI;
  AtomicBuffer *in_R9;
  long in_stack_00000038;
  long in_stack_00000040;
  long in_stack_00000048;
  undefined1 in_stack_ffffffffffffff0f;
  AtomicBuffer *in_stack_ffffffffffffff10;
  longlong *plVar2;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_long)>
  *in_stack_ffffffffffffff18;
  CountersReader *in_stack_ffffffffffffff20;
  
  in_RDI->_vptr_ClientConductor = (_func_int **)&PTR__ClientConductor_00227708;
  std::recursive_mutex::recursive_mutex((recursive_mutex *)0x1e3c5b);
  std::
  vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
  ::vector((vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
            *)0x1e3c74);
  std::
  vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
  ::vector((vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
            *)0x1e3c8d);
  std::
  vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
  ::vector((vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
            *)0x1e3ca6);
  std::
  vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
  ::vector((vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
            *)0x1e3cbf);
  std::
  vector<aeron::ClientConductor::LogBuffersLingerDefn,_std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>_>
  ::vector((vector<aeron::ClientConductor::LogBuffersLingerDefn,_std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>_>
            *)0x1e3cdb);
  std::
  vector<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>
  ::vector((vector<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>
            *)0x1e3cf7);
  in_RDI->m_driverProxy = in_RDX;
  DriverListenerAdapter<aeron::ClientConductor>::DriverListenerAdapter
            (&in_RDI->m_driverListenerAdapter,in_RCX,in_RDI);
  concurrent::CountersReader::CountersReader
            (in_stack_ffffffffffffff20,(AtomicBuffer *)in_stack_ffffffffffffff18,
             in_stack_ffffffffffffff10);
  in_RDI->m_counterValuesBuffer = in_R9;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_long)>
  ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_long)>
              *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_long)>
  ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_long)>
              *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_long)>
  ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_long)>
              *)in_stack_ffffffffffffff20,
             (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_long)>
              *)in_stack_ffffffffffffff18);
  std::function<void_(const_std::exception_&)>::function
            ((function<void_(const_std::exception_&)> *)in_stack_ffffffffffffff20,
             (function<void_(const_std::exception_&)> *)in_stack_ffffffffffffff18);
  std::function<void_(aeron::concurrent::CountersReader_&,_long,_int)>::function
            ((function<void_(aeron::concurrent::CountersReader_&,_long,_int)> *)
             in_stack_ffffffffffffff20,
             (function<void_(aeron::concurrent::CountersReader_&,_long,_int)> *)
             in_stack_ffffffffffffff18);
  std::function<void_(aeron::concurrent::CountersReader_&,_long,_int)>::function
            ((function<void_(aeron::concurrent::CountersReader_&,_long,_int)> *)
             in_stack_ffffffffffffff20,
             (function<void_(aeron::concurrent::CountersReader_&,_long,_int)> *)
             in_stack_ffffffffffffff18);
  std::function<long_long_()>::function
            ((function<long_long_()> *)in_stack_ffffffffffffff20,
             (function<long_long_()> *)in_stack_ffffffffffffff18);
  lVar1 = std::function<long_long_()>::operator()(in_RSI);
  in_RDI->m_timeOfLastKeepalive = lVar1;
  plVar2 = &in_RDI->m_timeOfLastCheckManagedResources;
  lVar1 = std::function<long_long_()>::operator()(in_RSI);
  *plVar2 = lVar1;
  plVar2 = &in_RDI->m_timeOfLastDoWork;
  lVar1 = std::function<long_long_()>::operator()(in_RSI);
  *plVar2 = lVar1;
  in_RDI->m_driverTimeoutMs = in_stack_00000038;
  in_RDI->m_resourceLingerTimeoutMs = in_stack_00000040;
  in_RDI->m_interServiceTimeoutMs = in_stack_00000048 / 1000000;
  std::atomic<bool>::atomic((atomic<bool> *)plVar2,(bool)in_stack_ffffffffffffff0f);
  std::atomic<bool>::atomic((atomic<bool> *)plVar2,(bool)in_stack_ffffffffffffff0f);
  return;
}

Assistant:

ClientConductor(
        epoch_clock_t epochClock,
        DriverProxy& driverProxy,
        CopyBroadcastReceiver& broadcastReceiver,
        AtomicBuffer& counterMetadataBuffer,
        AtomicBuffer& counterValuesBuffer,
        const on_new_publication_t& newPublicationHandler,
        const on_new_publication_t& newExclusivePublicationHandler,
        const on_new_subscription_t& newSubscriptionHandler,
        const exception_handler_t& errorHandler,
        const on_available_counter_t& availableCounterHandler,
        const on_unavailable_counter_t& unavailableCounterHandler,
        long driverTimeoutMs,
        long resourceLingerTimeoutMs,
        long long interServiceTimeoutNs) :
        m_driverProxy(driverProxy),
        m_driverListenerAdapter(broadcastReceiver, *this),
        m_countersReader(counterMetadataBuffer, counterValuesBuffer),
        m_counterValuesBuffer(counterValuesBuffer),
        m_onNewPublicationHandler(newPublicationHandler),
        m_onNewExclusivePublicationHandler(newExclusivePublicationHandler),
        m_onNewSubscriptionHandler(newSubscriptionHandler),
        m_errorHandler(errorHandler),
        m_onAvailableCounterHandler(availableCounterHandler),
        m_onUnavailableCounterHandler(unavailableCounterHandler),
        m_epochClock(epochClock),
        m_timeOfLastKeepalive(epochClock()),
        m_timeOfLastCheckManagedResources(epochClock()),
        m_timeOfLastDoWork(epochClock()),
        m_driverTimeoutMs(driverTimeoutMs),
        m_resourceLingerTimeoutMs(resourceLingerTimeoutMs),
        m_interServiceTimeoutMs(static_cast<long>(interServiceTimeoutNs / 1000000)),
        m_driverActive(true),
        m_isClosed(false)
    {
    }